

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status parse_ls32(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  size_t sVar1;
  curi_status cVar2;
  curi_status __TRY_tryStatus;
  size_t __TRY_initialOffset;
  curi_status tryStatus;
  size_t initialOffset;
  curi_status status;
  void *userData_local;
  curi_settings *settings_local;
  size_t *offset_local;
  size_t len_local;
  char *uri_local;
  
  initialOffset._4_4_ = curi_status_error;
  sVar1 = *offset;
  __TRY_initialOffset._4_4_ = parse_h16_and_colon(uri,len,offset,settings,userData);
  if (__TRY_initialOffset._4_4_ == curi_status_success) {
    __TRY_initialOffset._4_4_ = parse_h16(uri,len,offset,settings,userData);
  }
  if (__TRY_initialOffset._4_4_ == curi_status_error) {
    *offset = sVar1;
  }
  else {
    initialOffset._4_4_ = __TRY_initialOffset._4_4_;
  }
  cVar2 = initialOffset._4_4_;
  if (initialOffset._4_4_ == curi_status_error) {
    sVar1 = *offset;
    cVar2 = parse_IPv4address(uri,len,offset,settings,userData);
    if (cVar2 == curi_status_error) {
      *offset = sVar1;
      cVar2 = initialOffset._4_4_;
    }
  }
  initialOffset._4_4_ = cVar2;
  return initialOffset._4_4_;
}

Assistant:

static curi_status parse_ls32(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // ls32 = ( h16_and_colon h16 ) / IPv4address
    curi_status status = curi_status_error;

    if (status == curi_status_error)
    {
        size_t initialOffset = *offset;
        curi_status tryStatus = curi_status_success;

        if (tryStatus == curi_status_success)
            tryStatus = parse_h16_and_colon(uri, len, offset, settings, userData);
        if (tryStatus == curi_status_success)
            tryStatus = parse_h16(uri, len, offset, settings, userData);

        if (tryStatus == curi_status_error)
            *offset = initialOffset;
        else
            status = tryStatus;
    }

    if (status == curi_status_error)
        TRY(status,offset,parse_IPv4address(uri, len, offset, settings, userData));

    return status;
}